

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest42
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  bool bVar1;
  Application *pAVar2;
  Application *pAVar3;
  Application local_291;
  FieldBase local_238;
  FieldBase local_1e0;
  FieldBase local_188;
  FieldBase local_130;
  FieldBase local_d8;
  FieldBase local_80;
  
  pAVar2 = this;
  queryOrigClOrdID((OrigClOrdID *)((long)&local_291.super_Application._vptr_Application + 1),this);
  queryClOrdID((ClOrdID *)&local_238,pAVar2);
  pAVar2 = &local_291;
  local_291.super_Application._vptr_Application._0_1_ = 0x31;
  FIX::HandlInst::HandlInst((HandlInst *)&local_130,(CHAR *)pAVar2);
  querySymbol((Symbol *)&local_188,pAVar2);
  querySide((Side *)&local_1e0,pAVar2);
  FIX::TransactTime::TransactTime((TransactTime *)&local_80);
  queryOrdType((OrdType *)&local_d8,pAVar2);
  FIX42::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,
             (OrigClOrdID *)((long)&local_291.super_Application._vptr_Application + 1),
             (ClOrdID *)&local_238,(HandlInst *)&local_130,(Symbol *)&local_188,(Side *)&local_1e0,
             (TransactTime *)&local_80,(OrdType *)&local_d8);
  FIX::FieldBase::~FieldBase(&local_d8);
  FIX::FieldBase::~FieldBase(&local_80);
  FIX::FieldBase::~FieldBase(&local_1e0);
  FIX::FieldBase::~FieldBase(&local_188);
  FIX::FieldBase::~FieldBase(&local_130);
  FIX::FieldBase::~FieldBase(&local_238);
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_291.super_Application._vptr_Application + 1));
  pAVar2 = (Application *)((long)&local_291.super_Application._vptr_Application + 1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pAVar2,"New price",(allocator<char> *)&local_238);
  pAVar3 = (Application *)((long)&local_291.super_Application._vptr_Application + 1);
  bVar1 = queryConfirm(pAVar2,(string *)pAVar3);
  std::__cxx11::string::~string
            ((string *)((long)&local_291.super_Application._vptr_Application + 1));
  if (bVar1) {
    queryPrice((Price *)((long)&local_291.super_Application._vptr_Application + 1),pAVar3);
    FIX42::OrderCancelReplaceRequest::set
              (__return_storage_ptr__,
               (Price *)((long)&local_291.super_Application._vptr_Application + 1));
    FIX::FieldBase::~FieldBase
              ((FieldBase *)((long)&local_291.super_Application._vptr_Application + 1));
  }
  pAVar2 = (Application *)((long)&local_291.super_Application._vptr_Application + 1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pAVar2,"New quantity",(allocator<char> *)&local_238);
  pAVar3 = (Application *)((long)&local_291.super_Application._vptr_Application + 1);
  bVar1 = queryConfirm(pAVar2,(string *)pAVar3);
  std::__cxx11::string::~string
            ((string *)((long)&local_291.super_Application._vptr_Application + 1));
  if (bVar1) {
    queryOrderQty((OrderQty *)((long)&local_291.super_Application._vptr_Application + 1),pAVar3);
    FIX42::OrderCancelReplaceRequest::set
              (__return_storage_ptr__,
               (OrderQty *)((long)&local_291.super_Application._vptr_Application + 1));
    FIX::FieldBase::~FieldBase
              ((FieldBase *)((long)&local_291.super_Application._vptr_Application + 1));
  }
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX42::OrderCancelReplaceRequest Application::queryCancelReplaceRequest42() {
  FIX42::OrderCancelReplaceRequest cancelReplaceRequest(
      queryOrigClOrdID(),
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySymbol(),
      querySide(),
      FIX::TransactTime(),
      queryOrdType());

  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}